

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::default_cost_type<long_double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<long_double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  longdouble *plVar1;
  pointer ppVar2;
  uint uVar3;
  ulong uVar4;
  pointer ppVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  undefined8 extraout_RAX;
  pointer in_RCX;
  longdouble *plVar9;
  longdouble *plVar10;
  pointer ppVar11;
  pointer ppVar12;
  pointer ppVar13;
  baryonyx *this_00;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__urng;
  long lVar14;
  longdouble *plVar15;
  int iVar16;
  ulong value;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_long_double>
  __aurng;
  pointer __n;
  pointer ppVar17;
  longdouble in_ST0;
  longdouble lVar18;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar19;
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> r;
  allocator_type local_85;
  longdouble local_84;
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> local_78;
  longdouble local_60;
  uint local_54;
  default_cost_type<long_double> *local_50;
  undefined1 local_48 [16];
  ulong local_38;
  
  value = (ulong)(uint)n;
  __n = (pointer)(long)n;
  ppVar12 = __n;
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::vector
            (&local_78,(size_type)__n,&local_85);
  ppVar13 = local_78.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (n != 0) {
    plVar1 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    ppVar12 = (pointer)0x0;
    iVar16 = 0;
    do {
      *(unkbyte10 *)
       ((long)&(local_78.
                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first + (long)ppVar12 * 2) =
           *(unkbyte10 *)((long)ppVar12 + (long)plVar1);
      *(int *)((long)&(local_78.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->second + (long)ppVar12 * 2) =
           iVar16;
      iVar16 = iVar16 + 1;
      ppVar12 = (pointer)((long)ppVar12 + 0x10);
      in_RCX = local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while ((pointer)(value << 4) != ppVar12);
  }
  ppVar2 = local_78.
           super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar11 = local_78.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = n;
  local_50 = this;
  uVar4 = value;
  if (local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_54 = n;
    local_38 = value;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              ();
    ppVar12 = ppVar13;
    ppVar2 = local_78.
             super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar11 = local_78.
              super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar13 = local_78.
              super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = local_54;
    uVar4 = local_38;
  }
  for (; ppVar5 = local_78.
                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, local_54 = uVar3, local_38 = uVar4,
      ppVar2 != local_78.
                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
    lVar18 = ppVar2->first;
    local_84 = ppVar11->first;
    in_ST5 = in_ST4;
    if (((lVar18 != local_84) ||
        (ppVar17 = ppVar11,
        local_78.
        super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar13, NAN(lVar18) || NAN(local_84))) &&
       (in_RCX = (pointer)CONCAT71((int7)((ulong)in_RCX >> 8),ppVar2 == ppVar11), ppVar17 = ppVar2,
       local_78.
       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish = ppVar13, 0x20 < (long)ppVar2 - (long)ppVar11)) {
      local_60 = lVar18 - local_84;
      lVar18 = in_ST0;
      lVar19 = in_ST1;
      lVar6 = in_ST2;
      lVar7 = in_ST3;
      lVar8 = in_ST4;
      do {
        in_ST4 = in_ST5;
        in_ST3 = lVar8;
        in_ST2 = lVar7;
        in_ST1 = lVar6;
        in_ST0 = lVar19;
        in_ST5 = in_ST4;
        std::
        generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                  ((longdouble *)rng,
                   (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)ppVar12)
        ;
        ppVar11->first = local_84 + local_60 * lVar18;
        ppVar11 = ppVar11 + 1;
        lVar18 = in_ST0;
        lVar19 = in_ST1;
        lVar6 = in_ST2;
        lVar7 = in_ST3;
        lVar8 = in_ST4;
      } while (ppVar11 != ppVar2);
    }
    ppVar11 = ppVar17;
    ppVar13 = local_78.
              super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = local_54;
    uVar4 = local_38;
    local_78.
    super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar5;
  }
  if (0x20 < (long)local_78.
                   super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar11) {
    if ((long)ppVar11 -
        (long)local_78.
              super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      local_84 = ppVar11->first;
      lVar18 = (longdouble)1 + local_84;
      if ((local_84 == lVar18) && (!NAN(local_84) && !NAN(lVar18))) goto LAB_0019cecb;
      if (ppVar11 !=
          local_78.
          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_60 = lVar18 - local_84;
        __urng = (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x0;
        lVar18 = in_ST4;
        local_78.
        super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar13;
        do {
          lVar19 = lVar18;
          std::
          generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((longdouble *)rng,__urng);
          ppVar11->first = local_84 + local_60 * in_ST0;
          ppVar11 = ppVar11 + 1;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = lVar18;
          lVar18 = lVar19;
          ppVar13 = local_78.
                    super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar11 != ppVar5);
      }
    }
    else {
      this_00 = (baryonyx *)
                ((long)ppVar11 -
                 (long)local_78.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar13;
      linearize<long,long_double>
                ((longdouble *)0x0,this_00,
                 (long)ppVar13 -
                 (long)local_78.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,
                 (local_78.
                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first,(long)in_RCX,ppVar11->first,
                 value);
      local_84 = ppVar11->first;
      if ((local_84 == in_ST0) && (!NAN(local_84) && !NAN(in_ST0))) {
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
LAB_0019cecb:
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
        if (local_78.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(extraout_RAX);
      }
      ppVar13 = local_78.
                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar11 != ppVar5) {
        local_60 = in_ST0 - local_84;
        lVar18 = in_ST5;
        do {
          lVar19 = lVar18;
          std::
          generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((longdouble *)rng,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     this_00);
          ppVar11->first = local_84 + local_60 * in_ST1;
          ppVar11 = ppVar11 + 1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = lVar18;
          lVar18 = lVar19;
          ppVar13 = local_78.
                    super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar11 != ppVar5);
      }
    }
  }
  local_78.
  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppVar13;
  ppVar12 = local_78.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (ppVar12);
  }
  if (uVar3 != 0) {
    plVar1 = (local_50->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    lVar14 = 0;
    do {
      *(unkbyte10 *)((long)plVar1 + lVar14) =
           *(unkbyte10 *)
            ((long)&(local_78.
                     super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar14 * 2);
      lVar14 = lVar14 + 0x10;
    } while (uVar4 << 4 != lVar14);
  }
  plVar1 = (local_50->linear_elements)._M_t.
           super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
           super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
           super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
  plVar10 = plVar1;
  if (1 < uVar3) {
    lVar14 = (long)__n * 0x10 + -0x10;
    plVar15 = plVar1;
    plVar9 = plVar1;
    do {
      plVar9 = plVar9 + 1;
      plVar10 = plVar9;
      if (*plVar9 <= *plVar15) {
        plVar10 = plVar15;
      }
      lVar14 = lVar14 + -0x10;
      plVar15 = plVar10;
    } while (lVar14 != 0);
  }
  lVar18 = *plVar10;
  local_48._8_2_ = (undefined2)((unkuint10)lVar18 >> 0x40);
  local_48._0_8_ = SUB108(lVar18,0);
  if ((ushort)((local_48._8_2_ & 0x7fff) - 1) < 0x7ffe && (uVar3 != 0 && (long)local_48._0_8_ < 0))
  {
    lVar14 = 0;
    do {
      *(longdouble *)((long)plVar1 + lVar14) = *(longdouble *)((long)plVar1 + lVar14) / lVar18;
      lVar14 = lVar14 + 0x10;
    } while (uVar4 << 4 != lVar14);
  }
  if (local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_48._0_10_ = lVar18;
    operator_delete(local_78.
                    super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }